

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O0

Class * __thiscall camp::UserObject::getClass(UserObject *this)

{
  NullObject *__return_storage_ptr__;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [48];
  NullObject local_58;
  UserObject *local_10;
  UserObject *this_local;
  
  if (this->m_class != (Class *)0x0) {
    return this->m_class;
  }
  local_10 = this;
  __return_storage_ptr__ = (NullObject *)__cxa_allocate_exception(0x48);
  NullObject::NullObject(&local_58,this->m_class);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/userobject.cpp"
             ,&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"const Class &camp::UserObject::getClass() const",&local_b1)
  ;
  Error::prepare<camp::NullObject>
            (__return_storage_ptr__,&local_58,(string *)local_88,100,(string *)local_b0);
  __cxa_throw(__return_storage_ptr__,&NullObject::typeinfo,NullObject::~NullObject);
}

Assistant:

const Class& UserObject::getClass() const
{
    if (m_class)
    {
        return *m_class;
    }
    else
    {
        CAMP_ERROR(NullObject(m_class));
    }
}